

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::ICULocaleService::validateFallbackLocale(ICULocaleService *this)

{
  UBool UVar1;
  Locale *this_00;
  Mutex local_28;
  Mutex mutex;
  ICULocaleService *ncThis;
  Locale *loc;
  ICULocaleService *this_local;
  
  this_00 = Locale::getDefault();
  mutex.fMutex = (UMutex *)this;
  Mutex::Mutex(&local_28,(UMutex *)llock);
  UVar1 = Locale::operator!=(this_00,&this->fallbackLocale);
  if (UVar1 != '\0') {
    Locale::operator=((Locale *)(mutex.fMutex + 3),this_00);
    LocaleUtility::initNameFromLocale
              (this_00,(UnicodeString *)&mutex.fMutex[8].fMutex.__data.__list);
    ICUService::clearServiceCache((ICUService *)mutex.fMutex);
  }
  Mutex::~Mutex(&local_28);
  return &this->fallbackLocaleName;
}

Assistant:

const UnicodeString&
ICULocaleService::validateFallbackLocale() const
{
    const Locale&     loc    = Locale::getDefault();
    ICULocaleService* ncThis = (ICULocaleService*)this;
    {
        Mutex mutex(&llock);
        if (loc != fallbackLocale) {
            ncThis->fallbackLocale = loc;
            LocaleUtility::initNameFromLocale(loc, ncThis->fallbackLocaleName);
            ncThis->clearServiceCache();
        }
    }
    return fallbackLocaleName;
}